

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextDocument::adjustSize(QTextDocument *this)

{
  int iVar1;
  QAbstractTextDocumentLayout *pQVar2;
  QTextDocument *in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  double dVar4;
  qreal in_XMM1_Qa;
  qreal qVar5;
  QSizeF size;
  int w;
  int mw;
  QFontMetrics fm;
  QFont f;
  QFont *in_stack_ffffffffffffff78;
  QSizeF *this_00;
  QFontMetrics *in_stack_ffffffffffffff80;
  QSizeF *in_stack_ffffffffffffff88;
  QTextDocument *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffb8;
  QChar ch;
  QSizeF local_40;
  int local_2c;
  QChar local_26;
  int local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  ch.ucs = (char16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  defaultFont((QTextDocument *)in_stack_ffffffffffffff88);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QChar::QChar<char16_t,_true>(&local_26,L'x');
  local_2c = QFontMetrics::horizontalAdvance((QFontMetrics *)in_RDI,ch);
  local_2c = local_2c * 0x50;
  local_24 = local_2c;
  setTextWidth(in_stack_ffffffffffffff90,(qreal)in_stack_ffffffffffffff88);
  local_40.wd = -NAN;
  local_40.ht = -NAN;
  pQVar2 = documentLayout(in_RDI);
  local_40.wd = (qreal)(**(code **)(*(long *)pQVar2 + 0x78))();
  local_40.ht = in_XMM1_Qa;
  qVar3 = QSizeF::width(&local_40);
  if ((qVar3 != 0.0) || (NAN(qVar3))) {
    in_stack_ffffffffffffff88 = &local_40;
    qVar3 = QSizeF::height(in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff90 = (QTextDocument *)(qVar3 * 5.0);
    qVar3 = QSizeF::width(in_stack_ffffffffffffff88);
    qVar5 = 3.0;
    local_2c = qt_int_sqrt((uint)(long)(((double)in_stack_ffffffffffffff90 * qVar3) / 3.0));
    qMin<int>(&local_2c,&local_24);
    setTextWidth(in_stack_ffffffffffffff90,(qreal)in_stack_ffffffffffffff88);
    pQVar2 = documentLayout(in_RDI);
    local_40.wd = (qreal)(**(code **)(*(long *)pQVar2 + 0x78))();
    iVar1 = local_2c * 3;
    local_40.ht = qVar5;
    qVar3 = QSizeF::height(&local_40);
    if ((double)iVar1 < qVar3 * 5.0) {
      this_00 = &local_40;
      qVar3 = QSizeF::height(this_00);
      dVar4 = qVar3 + qVar3;
      qVar3 = QSizeF::width(this_00);
      local_2c = qt_int_sqrt((uint)(long)(dVar4 * qVar3));
      qMin<int>(&local_2c,&local_24);
      setTextWidth(in_stack_ffffffffffffff90,(qreal)in_stack_ffffffffffffff88);
    }
  }
  idealWidth((QTextDocument *)in_stack_ffffffffffffff88);
  setTextWidth(in_stack_ffffffffffffff90,(qreal)in_stack_ffffffffffffff88);
  QFontMetrics::~QFontMetrics((QFontMetrics *)0x7abdd9);
  QFont::~QFont((QFont *)0x7abde3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocument::adjustSize()
{
    // Pull this private function in from qglobal.cpp
    QFont f = defaultFont();
    QFontMetrics fm(f);
    int mw =  fm.horizontalAdvance(u'x') * 80;
    int w = mw;
    setTextWidth(w);
    QSizeF size = documentLayout()->documentSize();
    if (size.width() != 0) {
        w = qt_int_sqrt((uint)(5 * size.height() * size.width() / 3));
        setTextWidth(qMin(w, mw));

        size = documentLayout()->documentSize();
        if (w*3 < 5*size.height()) {
            w = qt_int_sqrt((uint)(2 * size.height() * size.width()));
            setTextWidth(qMin(w, mw));
        }
    }
    setTextWidth(idealWidth());
}